

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::scoped_dfs_traverser::check_repeat_group_start
          (scoped_dfs_traverser *this,scoped_dfs_traverser *newMatch)

{
  bool bVar1;
  group *pgVar2;
  group *pgVar3;
  reference this_00;
  child *pcVar4;
  reference pcVar5;
  bool local_32;
  bool local_31;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  local_28;
  group *local_20;
  group *newrg;
  scoped_dfs_traverser *newMatch_local;
  scoped_dfs_traverser *this_local;
  
  newrg = (group *)newMatch;
  newMatch_local = this;
  local_20 = innermost_repeat_group(newMatch);
  if (local_20 == (group *)0x0) {
    this->repeatGroupStarted_ = false;
  }
  else {
    pgVar2 = group::depth_first_traverser::innermost_repeat_group(&this->lastMatch_);
    if (pgVar2 == local_20) {
      if (((this->repeatGroupContinues_ & 1U) == 0) ||
         ((newrg[2].super_token<clipp::group>.doc_._M_string_length & 0x10000) == 0)) {
        this->repeatGroupStarted_ = true;
      }
      else {
        bVar1 = std::
                stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                ::empty(&this->scopes_);
        pgVar2 = local_20;
        local_31 = true;
        if (!bVar1) {
          pgVar3 = group::depth_first_traverser::root(&this->pos_);
          local_32 = false;
          if (pgVar2 == pgVar3) {
            this_00 = std::
                      stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                      ::top(&this->scopes_);
            pcVar4 = group::depth_first_traverser::memento::param(this_00);
            pgVar2 = group::depth_first_traverser::root(&this->pos_);
            local_28._M_current = (child_t<clipp::parameter,_clipp::group> *)group::begin(pgVar2);
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                     ::operator*(&local_28);
            local_32 = pcVar4 == pcVar5;
          }
          local_31 = local_32;
        }
        this->repeatGroupStarted_ = local_31;
      }
    }
    else {
      this->repeatGroupStarted_ = true;
    }
  }
  this->repeatGroupContinues_ = (bool)(this->repeatGroupStarted_ & 1);
  return;
}

Assistant:

void check_repeat_group_start(const scoped_dfs_traverser& newMatch)
    {
        const auto newrg = newMatch.innermost_repeat_group();
        if(!newrg) {
            repeatGroupStarted_ = false;
        }
        else if(lastMatch_.innermost_repeat_group() != newrg) {
            repeatGroupStarted_ = true;
        }
        else if(!repeatGroupContinues_ || !newMatch.repeatGroupContinues_) {
            repeatGroupStarted_ = true;
        }
        else {
            //special case: repeat group is outermost group
            //=> we can never really 'leave' and 'reenter' it
            //but if the current scope is the first element, then we are
            //conceptually at a position 'before' the group
            repeatGroupStarted_ = scopes_.empty() || (
                    newrg == pos_.root() &&
                    scopes_.top().param() == &(*pos_.root()->begin()) );
        }
        repeatGroupContinues_ = repeatGroupStarted_;
    }